

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFactoryRegistry.cpp
# Opt level: O0

void __thiscall tcu::GenericFactoryRegistry::~GenericFactoryRegistry(GenericFactoryRegistry *this)

{
  bool bVar1;
  reference ppAVar2;
  __normal_iterator<tcu::AbstractFactory_**,_std::vector<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>_>
  local_28;
  __normal_iterator<tcu::AbstractFactory_**,_std::vector<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>_>
  local_20;
  __normal_iterator<tcu::AbstractFactory_*const_*,_std::vector<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>_>
  local_18;
  const_iterator i;
  GenericFactoryRegistry *this_local;
  
  i._M_current = (AbstractFactory **)this;
  local_20._M_current =
       (AbstractFactory **)
       std::vector<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>::begin
                 (&this->m_factories);
  __gnu_cxx::
  __normal_iterator<tcu::AbstractFactory*const*,std::vector<tcu::AbstractFactory*,std::allocator<tcu::AbstractFactory*>>>
  ::__normal_iterator<tcu::AbstractFactory**>
            ((__normal_iterator<tcu::AbstractFactory*const*,std::vector<tcu::AbstractFactory*,std::allocator<tcu::AbstractFactory*>>>
              *)&local_18,&local_20);
  while( true ) {
    local_28._M_current =
         (AbstractFactory **)
         std::vector<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>::end
                   (&this->m_factories);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppAVar2 = __gnu_cxx::
              __normal_iterator<tcu::AbstractFactory_*const_*,_std::vector<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>_>
              ::operator*(&local_18);
    if (*ppAVar2 != (AbstractFactory *)0x0) {
      (*(*ppAVar2)->_vptr_AbstractFactory[1])();
    }
    __gnu_cxx::
    __normal_iterator<tcu::AbstractFactory_*const_*,_std::vector<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>::~vector
            (&this->m_factories);
  return;
}

Assistant:

GenericFactoryRegistry::~GenericFactoryRegistry (void)
{
	for (std::vector<AbstractFactory*>::const_iterator i = m_factories.begin(); i != m_factories.end(); ++i)
		delete *i;
}